

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR __thiscall NpyArray::LoadNPZ(NpyArray *this,string *filename,string *varname)

{
  LPCSTR pcVar1;
  char *pcVar2;
  FILE *fp;
  ScopeExitRun closeFp;
  FILE *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  function<void_()> local_38;
  
  Release(this);
  local_60 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_60 == (FILE *)0x0) {
    pcVar2 = "error: unable to open file";
  }
  else {
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = &local_60;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:202:29)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:202:29)>
               ::_M_manager;
    std::function<void_()>::function(&local_38,(function<void_()> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    pcVar2 = "error: variable name not found";
    do {
      pcVar1 = LoadArrayNPZ((FILE *)local_60,varname,this);
      if ((pcVar1 == (LPCSTR)0x0) && (this->data != (uint8_t *)0x0)) {
        pcVar2 = (LPCSTR)0x0;
        break;
      }
    } while (pcVar1 != (LPCSTR)0x1);
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)&local_38);
  }
  return pcVar2;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, std::string varname)
{
	Release();
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		const LPCSTR ret = LoadArrayNPZ(fp, varname, *this);
		if (ret == NULL && !IsEmpty())
			return NULL;
		if (ret == (const char*)1)
			break;
	}
	return "error: variable name not found";
}